

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QSize>_>::rehash
          (Data<QHashPrivate::Node<QString,_QSize>_> *this,size_t sizeHint)

{
  Entry *pEVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Node<QString,_QSize> *pNVar9;
  ulong uVar10;
  Span *pSVar11;
  size_t index;
  long lVar12;
  size_t sVar13;
  long lVar14;
  R RVar15;
  Bucket BVar16;
  QStringView QVar17;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar13 = 0x80;
  if ((0x40 < sizeHint) && (sVar13 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    sVar13 = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar15 = allocateSpans(sVar13);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = sVar13;
  if (uVar3 < 0x80) {
    if (pSVar4 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar10 = 0;
    pSVar11 = pSVar4;
    do {
      lVar12 = 0;
      do {
        bVar2 = pSVar11->offsets[lVar12];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar10].entries;
          QVar17.m_data = *(storage_type_conflict **)(pEVar5[bVar2].storage.data + 8);
          QVar17.m_size = *(qsizetype *)(pEVar5[bVar2].storage.data + 0x10);
          sVar13 = qHash(QVar17,this->seed);
          BVar16 = findBucketWithHash<QString>(this,(QString *)(pEVar5 + bVar2),sVar13);
          pNVar9 = Span<QHashPrivate::Node<QString,_QSize>_>::insert(BVar16.span,BVar16.index);
          pDVar6 = *(Data **)pEVar5[bVar2].storage.data;
          pEVar1 = pEVar5 + bVar2;
          (pEVar1->storage).data[0] = '\0';
          (pEVar1->storage).data[1] = '\0';
          (pEVar1->storage).data[2] = '\0';
          (pEVar1->storage).data[3] = '\0';
          (pEVar1->storage).data[4] = '\0';
          (pEVar1->storage).data[5] = '\0';
          (pEVar1->storage).data[6] = '\0';
          (pEVar1->storage).data[7] = '\0';
          (pNVar9->key).d.d = pDVar6;
          pcVar7 = *(char16_t **)(pEVar5[bVar2].storage.data + 8);
          pEVar1 = pEVar5 + bVar2;
          (pEVar1->storage).data[8] = '\0';
          (pEVar1->storage).data[9] = '\0';
          (pEVar1->storage).data[10] = '\0';
          (pEVar1->storage).data[0xb] = '\0';
          (pEVar1->storage).data[0xc] = '\0';
          (pEVar1->storage).data[0xd] = '\0';
          (pEVar1->storage).data[0xe] = '\0';
          (pEVar1->storage).data[0xf] = '\0';
          (pNVar9->key).d.ptr = pcVar7;
          qVar8 = *(qsizetype *)(pEVar5[bVar2].storage.data + 0x10);
          pEVar1 = pEVar5 + bVar2;
          (pEVar1->storage).data[0x10] = '\0';
          (pEVar1->storage).data[0x11] = '\0';
          (pEVar1->storage).data[0x12] = '\0';
          (pEVar1->storage).data[0x13] = '\0';
          (pEVar1->storage).data[0x14] = '\0';
          (pEVar1->storage).data[0x15] = '\0';
          (pEVar1->storage).data[0x16] = '\0';
          (pEVar1->storage).data[0x17] = '\0';
          (pNVar9->key).d.size = qVar8;
          pNVar9->value = *(QSize *)(pEVar5[bVar2].storage.data + 0x18);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::Node<QString,_QSize>_>::freeData(pSVar4 + uVar10);
      uVar10 = uVar10 + 1;
      pSVar11 = pSVar11 + 1;
    } while (uVar10 != uVar3 >> 7);
  }
  lVar12 = *(long *)&pSVar4[-1].allocated;
  if (lVar12 != 0) {
    lVar14 = lVar12 * 0x90;
    do {
      Span<QHashPrivate::Node<QString,_QSize>_>::freeData
                ((Span<QHashPrivate::Node<QString,_QSize>_> *)(pSVar4[-1].offsets + lVar14));
      lVar14 = lVar14 + -0x90;
    } while (lVar14 != 0);
  }
  operator_delete__(&pSVar4[-1].allocated,lVar12 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }